

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedEnvelopes.cpp
# Opt level: O2

double __thiscall
IsoSpec::FixedEnvelope::WassersteinDistance(FixedEnvelope *this,FixedEnvelope *other)

{
  double dVar1;
  double dVar2;
  logic_error *this_00;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = get_total_prob(this);
  dVar6 = get_total_prob(other);
  if (dVar5 * 0.999 <= dVar6) {
    dVar5 = get_total_prob(other);
    dVar6 = get_total_prob(this);
    if (dVar5 <= dVar6 * 1.001) {
      dVar5 = 0.0;
      if ((this->_confs_no != 0) && (other->_confs_no != 0)) {
        sort_by_mass(this);
        sort_by_mass(other);
        dVar5 = 0.0;
        uVar4 = 0;
        uVar3 = 0;
        dVar7 = 0.0;
        dVar6 = 0.0;
        while ((uVar4 < this->_confs_no && (uVar3 < other->_confs_no))) {
          dVar1 = this->_masses[uVar4];
          dVar2 = other->_masses[uVar3];
          if (dVar1 < dVar2) {
            dVar5 = dVar5 + (dVar1 - dVar6) * ABS(dVar7);
            dVar7 = dVar7 + this->_probs[uVar4];
            uVar4 = uVar4 + 1;
            dVar6 = dVar1;
          }
          else {
            dVar5 = dVar5 + (dVar2 - dVar6) * ABS(dVar7);
            dVar7 = dVar7 - other->_probs[uVar3];
            uVar3 = uVar3 + 1;
            dVar6 = dVar2;
          }
        }
        dVar7 = ABS(dVar7);
        for (; uVar4 < this->_confs_no; uVar4 = uVar4 + 1) {
          dVar1 = this->_masses[uVar4];
          dVar5 = dVar5 + (dVar1 - dVar6) * dVar7;
          dVar7 = dVar7 - this->_probs[uVar4];
          dVar6 = dVar1;
        }
        for (; uVar3 < other->_confs_no; uVar3 = uVar3 + 1) {
          dVar1 = other->_masses[uVar3];
          dVar5 = dVar5 + (dVar1 - dVar6) * dVar7;
          dVar7 = dVar7 - other->_probs[uVar3];
          dVar6 = dVar1;
        }
      }
      return dVar5;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"Spectra must be normalized before computing Wasserstein Distance");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

double FixedEnvelope::WassersteinDistance(FixedEnvelope& other)
{
    double ret = 0.0;
    if((get_total_prob()*0.999 > other.get_total_prob()) || (other.get_total_prob() > get_total_prob()*1.001))
        throw std::logic_error("Spectra must be normalized before computing Wasserstein Distance");

    if(_confs_no == 0 || other._confs_no == 0)
        return 0.0;

    sort_by_mass();
    other.sort_by_mass();

    size_t idx_this = 0;
    size_t idx_other = 0;

    double acc_prob = 0.0;
    double last_point = 0.0;


    while(idx_this < _confs_no && idx_other < other._confs_no)
    {
        if(_masses[idx_this] < other._masses[idx_other])
        {
            ret += (_masses[idx_this] - last_point) * std::abs(acc_prob);
            acc_prob += _probs[idx_this];
            last_point = _masses[idx_this];
            idx_this++;
        }
        else
        {
            ret += (other._masses[idx_other] - last_point) * std::abs(acc_prob);
            acc_prob -= other._probs[idx_other];
            last_point = other._masses[idx_other];
            idx_other++;
        }
    }

    acc_prob = std::abs(acc_prob);

    while(idx_this < _confs_no)
    {
        ret += (_masses[idx_this] - last_point) * acc_prob;
        acc_prob -= _probs[idx_this];
        last_point = _masses[idx_this];
        idx_this++;
    }

    while(idx_other < other._confs_no)
    {
        ret += (other._masses[idx_other] - last_point) * acc_prob;
        acc_prob -= other._probs[idx_other];
        last_point = other._masses[idx_other];
        idx_other++;
    }

    return ret;
}